

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

iterator __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
::find<char[2]>(raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                *this,key_arg<char[2]> *key)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  anon_union_8_1_a8a14541_for_iterator_1 extraout_RDX;
  anon_union_8_1_a8a14541_for_iterator_1 extraout_RDX_00;
  anon_union_8_1_a8a14541_for_iterator_1 extraout_RDX_01;
  anon_union_8_1_a8a14541_for_iterator_1 aVar6;
  slot_type *unaff_R13;
  ulong uVar7;
  undefined1 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  iterator iVar12;
  __m128i match;
  probe_seq<16UL> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [16];
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  local_90.mask_ = 1;
  local_90.offset_ = 0x17b058;
  sVar5 = Hash<std::basic_string_view<char,_std::char_traits<char>_>_>::
          _hash<std::basic_string_view<char,_std::char_traits<char>_>,_0>
                    ((Hash<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &this->settings_,(basic_string_view<char,_std::char_traits<char>_> *)&local_90)
  ;
  aVar6 = extraout_RDX;
  if (this->ctrl_ != (ctrl_t *)0x0) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = sVar5;
    sVar5 = SUB168(auVar9 * ZEXT816(0xde5fb9d2630458e9),8) +
            SUB168(auVar9 * ZEXT816(0xde5fb9d2630458e9),0);
    probe(&local_90,this,sVar5);
    uVar8 = (undefined1)sVar5;
    auVar9 = ZEXT216(CONCAT11(uVar8,uVar8) & 0x7f7f);
    auVar9 = pshuflw(auVar9,auVar9,0);
    local_58._0_4_ = auVar9._0_4_;
    local_58._4_4_ = local_58._0_4_;
    local_58._8_4_ = local_58._0_4_;
    local_58._12_4_ = local_58._0_4_;
    aVar6 = extraout_RDX_00;
    while( true ) {
      pcVar1 = (char *)(local_90.offset_ + (long)this->ctrl_);
      local_48 = *pcVar1;
      cStack_47 = pcVar1[1];
      cStack_46 = pcVar1[2];
      cStack_45 = pcVar1[3];
      cStack_44 = pcVar1[4];
      cStack_43 = pcVar1[5];
      cStack_42 = pcVar1[6];
      cStack_41 = pcVar1[7];
      cStack_40 = pcVar1[8];
      cStack_3f = pcVar1[9];
      cStack_3e = pcVar1[10];
      cStack_3d = pcVar1[0xb];
      cStack_3c = pcVar1[0xc];
      cStack_3b = pcVar1[0xd];
      cStack_3a = pcVar1[0xe];
      cStack_39 = pcVar1[0xf];
      auVar10[0] = -(local_58[0] == local_48);
      auVar10[1] = -(local_58[1] == cStack_47);
      auVar10[2] = -(local_58[2] == cStack_46);
      auVar10[3] = -(local_58[3] == cStack_45);
      auVar10[4] = -(local_58[4] == cStack_44);
      auVar10[5] = -(local_58[5] == cStack_43);
      auVar10[6] = -(local_58[6] == cStack_42);
      auVar10[7] = -(local_58[7] == cStack_41);
      auVar10[8] = -(local_58[8] == cStack_40);
      auVar10[9] = -(local_58[9] == cStack_3f);
      auVar10[10] = -(local_58[10] == cStack_3e);
      auVar10[0xb] = -(local_58[0xb] == cStack_3d);
      auVar10[0xc] = -(local_58[0xc] == cStack_3c);
      auVar10[0xd] = -(local_58[0xd] == cStack_3b);
      auVar10[0xe] = -(local_58[0xe] == cStack_3a);
      auVar10[0xf] = -(local_58[0xf] == cStack_39);
      for (uVar4 = (uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar10[0xf] >> 7) << 0xf); uVar4 != 0;
          uVar4 = uVar4 - 1 & uVar4) {
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar7 = (ulong)(local_90.offset_ + uVar2) & local_90.mask_;
        unaff_R13 = (slot_type *)(uVar7 * 0x40);
        local_78._M_str = this->slots_[uVar7].pair.first._M_dataplus._M_p;
        local_78._M_len = this->slots_[uVar7].pair.first._M_string_length;
        local_68._M_len = 1;
        local_68._M_str = "a";
        bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           &this->settings_,&local_78,&local_68);
        aVar6 = extraout_RDX_01;
        if (bVar3) {
          unaff_R13 = this->slots_ + uVar7;
          goto LAB_0012d8a6;
        }
      }
      auVar11[0] = -(local_48 == -0x80);
      auVar11[1] = -(cStack_47 == -0x80);
      auVar11[2] = -(cStack_46 == -0x80);
      auVar11[3] = -(cStack_45 == -0x80);
      auVar11[4] = -(cStack_44 == -0x80);
      auVar11[5] = -(cStack_43 == -0x80);
      auVar11[6] = -(cStack_42 == -0x80);
      auVar11[7] = -(cStack_41 == -0x80);
      auVar11[8] = -(cStack_40 == -0x80);
      auVar11[9] = -(cStack_3f == -0x80);
      auVar11[10] = -(cStack_3e == -0x80);
      auVar11[0xb] = -(cStack_3d == -0x80);
      auVar11[0xc] = -(cStack_3c == -0x80);
      auVar11[0xd] = -(cStack_3b == -0x80);
      auVar11[0xe] = -(cStack_3a == -0x80);
      auVar11[0xf] = -(cStack_39 == -0x80);
      if ((((((((((((((((auVar11 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar11 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar11 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar11 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar11 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar11 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar11 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar11 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar11 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar11 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar11 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar11 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar11 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar11 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar11 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cStack_39 == -0x80)
      break;
      local_90.index_ = local_90.index_ + 0x10;
      local_90.offset_ = (ulong)(local_90.offset_ + local_90.index_) & local_90.mask_;
    }
  }
LAB_0012d8a6:
  iVar12.field_1.slot_ = aVar6.slot_;
  iVar12.ctrl_ = (ctrl_t *)unaff_R13;
  return iVar12;
}

Assistant:

iterator find(const key_arg<K>& key) {
        return find(key, this->hash(key));
    }